

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int cmcmd::VisualStudioLink
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,int type)

{
  pointer pbVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pointer __x;
  string_view str;
  cmConsoleBuf consoleBuf;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmVSLink vsLink;
  
  cmConsoleBuf::cmConsoleBuf(&consoleBuf);
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    iVar5 = -1;
  }
  else {
    bVar3 = cmsys::SystemTools::HasEnv("VERBOSE");
    expandedArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expandedArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expandedArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__x = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __x != pbVar1; __x = __x + 1) {
      pcVar2 = (__x->_M_dataplus)._M_p;
      if (*pcVar2 == '@') {
        str._M_str = pcVar2;
        str._M_len = __x->_M_string_length;
        bVar4 = cmHasLiteralPrefix<12ul>(str,(char (*) [12])"@CMakeFiles");
        if (bVar4) goto LAB_00187df9;
        std::__cxx11::string::substr((ulong)&line,(ulong)__x);
        std::ifstream::ifstream(&vsLink,line._M_dataplus._M_p,_S_in);
        std::__cxx11::string::~string((string *)&line);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        while( true ) {
          bVar4 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&vsLink,&line,(bool *)0x0,0xffffffffffffffff);
          if (!bVar4) break;
          cmSystemTools::ParseWindowsCommandLine(line._M_dataplus._M_p,&expandedArgs);
        }
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream(&vsLink);
      }
      else {
LAB_00187df9:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&expandedArgs,__x);
      }
    }
    vsLink.LinkerManifestFile._M_dataplus._M_p = (pointer)&vsLink.LinkerManifestFile.field_2;
    vsLink.Incremental = false;
    vsLink.LinkGeneratesManifest = true;
    vsLink.LinkCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vsLink.LinkCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vsLink.LinkCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vsLink.UserManifests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vsLink.UserManifests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vsLink.UserManifests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vsLink.LinkerManifestFile._M_string_length = 0;
    vsLink.LinkerManifestFile.field_2._M_local_buf[0] = '\0';
    vsLink.ManifestFile._M_dataplus._M_p = (pointer)&vsLink.ManifestFile.field_2;
    vsLink.ManifestFile._M_string_length = 0;
    vsLink.ManifestFile.field_2._M_local_buf[0] = '\0';
    vsLink.ManifestFileRC._M_dataplus._M_p = (pointer)&vsLink.ManifestFileRC.field_2;
    vsLink.ManifestFileRC._M_string_length = 0;
    vsLink.ManifestFileRC.field_2._M_local_buf[0] = '\0';
    vsLink.ManifestFileRes._M_dataplus._M_p = (pointer)&vsLink.ManifestFileRes.field_2;
    vsLink.ManifestFileRes._M_string_length = 0;
    vsLink.ManifestFileRes.field_2._M_local_buf[0] = '\0';
    vsLink.TargetFile._M_dataplus._M_p = (pointer)&vsLink.TargetFile.field_2;
    vsLink.TargetFile._M_string_length = 0;
    vsLink.TargetFile.field_2._M_local_buf[0] = '\0';
    vsLink.MtPath._M_dataplus._M_p = (pointer)&vsLink.MtPath.field_2;
    vsLink.MtPath._M_string_length = 0;
    vsLink.MtPath.field_2._M_local_buf[0] = '\0';
    vsLink.RcPath._M_dataplus._M_p = (pointer)&vsLink.RcPath.field_2;
    vsLink.RcPath._M_string_length = 0;
    vsLink.RcPath.field_2._M_local_buf[0] = '\0';
    vsLink.Type = type;
    vsLink.Verbose = bVar3;
    bVar3 = cmVSLink::Parse(&vsLink,expandedArgs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2,
                            (const_iterator)
                            expandedArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar3) {
      iVar5 = cmVSLink::Link(&vsLink);
    }
    else {
      iVar5 = -1;
    }
    cmVSLink::~cmVSLink(&vsLink);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&expandedArgs);
  }
  return iVar5;
}

Assistant:

int cmcmd::VisualStudioLink(std::vector<std::string> const& args, int type)
{
  // Replace streambuf so we output in the system codepage. CMake is set up
  // to output in Unicode (see SetUTF8Pipes) but the Visual Studio linker
  // outputs using the system codepage so we need to change behavior when
  // we run the link command.
  cmConsoleBuf consoleBuf;

  if (args.size() < 2) {
    return -1;
  }
  const bool verbose = cmSystemTools::HasEnv("VERBOSE");
  std::vector<std::string> expandedArgs;
  for (std::string const& i : args) {
    // check for nmake temporary files
    if (i[0] == '@' && !cmHasLiteralPrefix(i, "@CMakeFiles")) {
      cmsys::ifstream fin(i.substr(1).c_str());
      std::string line;
      while (cmSystemTools::GetLineFromStream(fin, line)) {
        cmSystemTools::ParseWindowsCommandLine(line.c_str(), expandedArgs);
      }
    } else {
      expandedArgs.push_back(i);
    }
  }

  cmVSLink vsLink(type, verbose);
  if (!vsLink.Parse(expandedArgs.begin() + 2, expandedArgs.end())) {
    return -1;
  }
  return vsLink.Link();
}